

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void amrex::anon_unknown_12::bldTable
               (char **str,
               list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *tab)

{
  bool bVar1;
  ulong uVar2;
  reference_conflict pvVar3;
  char **in_RSI;
  string msg;
  PType token;
  string tokname;
  string tmp_str;
  Table cur_table;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cur_list;
  string cur_name;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffee0;
  value_type *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  string *this;
  allocator local_f9;
  string local_f8 [32];
  int local_d8;
  PType local_c4;
  string local_c0 [24];
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
  *in_stack_ffffffffffffff58;
  Table *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  undefined1 local_68 [48];
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
  *in_stack_ffffffffffffffc8;
  
  std::__cxx11::string::string((string *)(local_68 + 0x18));
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x11b3ea1);
  std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::list
            ((list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
             0x11b3eae);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff60);
  do {
    this = local_c0;
    std::__cxx11::string::string(this);
    local_c4 = getToken((char **)this,in_stack_fffffffffffffef0);
    in_stack_fffffffffffffef0 = (string *)(ulong)local_c4;
    switch(in_stack_fffffffffffffef0) {
    case (string *)0x0:
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) goto switchD_011b3f10_caseD_1;
      std::__cxx11::string::operator=((string *)(local_68 + 0x18),local_c0);
      break;
    case (string *)0x1:
switchD_011b3f10_caseD_1:
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_f8,"ParmParse::bldTable(): value with no defn: ",&local_f9);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        std::__cxx11::string::operator+=(local_f8,local_c0);
        std::__cxx11::string::c_str();
        Abort_host((char *)in_stack_fffffffffffffef0);
        std::__cxx11::string::~string(local_f8);
      }
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      break;
    case (string *)0x2:
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        Abort_host((char *)in_stack_fffffffffffffef0);
      }
      bVar1 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_68);
      if (!bVar1) {
        pvVar3 = std::__cxx11::
                 list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back(in_stack_fffffffffffffee0);
        std::__cxx11::string::operator=((string *)&stack0xffffffffffffff60,(string *)pvVar3);
        in_stack_fffffffffffffee0 =
             (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68;
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(in_stack_fffffffffffffee0);
        addDefn(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                (list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
                in_stack_ffffffffffffff68);
        std::__cxx11::string::operator=
                  ((string *)(local_68 + 0x18),(string *)&stack0xffffffffffffff60);
      }
      break;
    case (string *)0x3:
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        Abort_host((char *)in_stack_fffffffffffffef0);
      }
      bVar1 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_68);
      if (!bVar1) {
        pvVar3 = std::__cxx11::
                 list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back(in_stack_fffffffffffffee0);
        std::__cxx11::string::operator=((string *)&stack0xffffffffffffff60,(string *)pvVar3);
        in_stack_fffffffffffffee8 = (value_type *)local_68;
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(in_stack_fffffffffffffee0);
        addDefn(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                (list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
                in_stack_ffffffffffffff68);
        std::__cxx11::string::operator=
                  ((string *)(local_68 + 0x18),(string *)&stack0xffffffffffffff60);
      }
      bldTable(in_RSI,in_stack_ffffffffffffffc8);
      addTable(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      break;
    case (string *)0x4:
      uVar2 = std::__cxx11::string::empty();
      if (((uVar2 & 1) == 0) &&
         (bVar1 = std::__cxx11::
                  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_68), bVar1)) {
        Abort_host((char *)in_stack_fffffffffffffef0);
      }
    case (string *)0x5:
      addDefn(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
              (list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
              in_stack_ffffffffffffff68);
      local_d8 = 1;
      goto LAB_011b4236;
    }
    local_d8 = 0;
LAB_011b4236:
    std::__cxx11::string::~string(local_c0);
    if (local_d8 != 0) {
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
      ~list((list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
            0x11b42a9);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x11b42b6);
      std::__cxx11::string::~string((string *)(local_68 + 0x18));
      return;
    }
  } while( true );
}

Assistant:

void
bldTable (const char*&                    str,
          std::list<ParmParse::PP_entry>& tab)
{
    std::string            cur_name;
    std::list<std::string> cur_list;
    ParmParse::Table       cur_table;
    std::string            tmp_str;

    for (;;)
    {
        std::string tokname;

        PType token = getToken(str,tokname);

        switch (token)
        {
        case pCloseBracket:
            if ( !cur_name.empty() && cur_list.empty() )
            {
                amrex::Abort("ParmParse::bldTable() defn with no list");
            }
            AMREX_FALLTHROUGH;
        case pEOF:
            addDefn(cur_name,cur_list,tab);
            return;
        case pOpenBracket:
            if ( cur_name.empty() )
            {
                amrex::Abort("ParmParse::bldTabe() '{' with no blocknamne");
            }
            if ( !cur_list.empty() )
            {
                tmp_str = cur_list.back();
                cur_list.pop_back();
                addDefn(cur_name, cur_list, tab);
                cur_name = tmp_str;
            }
            bldTable(str, cur_table);
            addTable(cur_name, cur_table, tab);
            break;
        case pEQ_sign:
            if ( cur_name.empty() )
            {
                amrex::Abort("ParmParse::bldTable() EQ with no current defn");
            }
            if ( !cur_list.empty() )
            {
                tmp_str = cur_list.back();
                cur_list.pop_back();
                addDefn(cur_name,cur_list,tab);
                cur_name = tmp_str;
            }
            //
            // Read one too far, remove last name on list.
            //
            break;
        case pDefn:
            if ( cur_name.empty() )
            {
                cur_name = tokname;
                break;
            }
            //
            // Otherwise, fall through, this may be a string.
            //
            AMREX_FALLTHROUGH;
        case pValue:
            if ( cur_name.empty() )
            {
                std::string msg("ParmParse::bldTable(): value with no defn: ");
                msg += tokname;
                amrex::Abort(msg.c_str());
            }
            cur_list.push_back(tokname);
            break;
        }
    }
}